

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

bool __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::reserve
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length)

{
  long lVar1;
  C *pCVar2;
  long *in_RDI;
  size_t oldLength;
  bool in_stack_0000004f;
  size_t in_stack_00000050;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_00000058;
  
  lVar1 = in_RDI[2];
  pCVar2 = createBuffer(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  if (pCVar2 != (C *)0x0) {
    in_RDI[2] = lVar1;
    *(undefined1 *)(*in_RDI + lVar1) = 0;
  }
  return pCVar2 != (C *)0x0;
}

Assistant:

bool
	reserve(size_t length) {
		size_t oldLength = this->m_length;
		if (!createBuffer(length, true))
			return false;

		ASSERT(this->m_isNullTerminated);
		this->m_length = oldLength; // restore original length
		this->m_p[oldLength] = 0;
		return true;
	}